

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

int xmlRegCheckCharacterRange
              (xmlRegAtomType type,int codepoint,int neg,int start,int end,xmlChar *blockName)

{
  uint uVar1;
  int iVar2;
  undefined4 in_register_00000084;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  
  bVar4 = false;
  bVar3 = false;
  bVar5 = bVar4;
  switch(type) {
  case XML_REGEXP_LETTER:
    uVar1 = xmlUCSIsCatL(codepoint);
    break;
  case XML_REGEXP_LETTER_UPPERCASE:
    uVar1 = xmlUCSIsCatLu(codepoint);
    break;
  case XML_REGEXP_LETTER_LOWERCASE:
    uVar1 = xmlUCSIsCatLl(codepoint);
    break;
  case XML_REGEXP_LETTER_TITLECASE:
    uVar1 = xmlUCSIsCatLt(codepoint);
    break;
  case XML_REGEXP_LETTER_MODIFIER:
    uVar1 = xmlUCSIsCatLm(codepoint);
    break;
  case XML_REGEXP_LETTER_OTHERS:
    uVar1 = xmlUCSIsCatLo(codepoint);
    break;
  case XML_REGEXP_MARK:
    uVar1 = xmlUCSIsCatM(codepoint);
    break;
  case XML_REGEXP_MARK_NONSPACING:
    uVar1 = xmlUCSIsCatMn(codepoint);
    break;
  case XML_REGEXP_MARK_SPACECOMBINING:
    uVar1 = xmlUCSIsCatMc(codepoint);
    break;
  case XML_REGEXP_MARK_ENCLOSING:
    uVar1 = xmlUCSIsCatMe(codepoint);
    break;
  case XML_REGEXP_NUMBER:
    uVar1 = xmlUCSIsCatN(codepoint);
    break;
  case XML_REGEXP_NUMBER_DECIMAL:
    goto switchD_001ad17d_caseD_6f;
  case XML_REGEXP_NUMBER_LETTER:
    uVar1 = xmlUCSIsCatNl(codepoint);
    break;
  case XML_REGEXP_NUMBER_OTHERS:
    uVar1 = xmlUCSIsCatNo(codepoint);
    break;
  case XML_REGEXP_PUNCT:
    uVar1 = xmlUCSIsCatP(codepoint);
    break;
  case XML_REGEXP_PUNCT_CONNECTOR:
    uVar1 = xmlUCSIsCatPc(codepoint);
    break;
  case XML_REGEXP_PUNCT_DASH:
    uVar1 = xmlUCSIsCatPd(codepoint);
    break;
  case XML_REGEXP_PUNCT_OPEN:
    uVar1 = xmlUCSIsCatPs(codepoint);
    break;
  case XML_REGEXP_PUNCT_CLOSE:
    uVar1 = xmlUCSIsCatPe(codepoint);
    break;
  case XML_REGEXP_PUNCT_INITQUOTE:
    uVar1 = xmlUCSIsCatPi(codepoint);
    break;
  case XML_REGEXP_PUNCT_FINQUOTE:
    uVar1 = xmlUCSIsCatPf(codepoint);
    break;
  case XML_REGEXP_PUNCT_OTHERS:
    uVar1 = xmlUCSIsCatPo(codepoint);
    break;
  case XML_REGEXP_SEPAR:
    uVar1 = xmlUCSIsCatZ(codepoint);
    break;
  case XML_REGEXP_SEPAR_SPACE:
    uVar1 = xmlUCSIsCatZs(codepoint);
    break;
  case XML_REGEXP_SEPAR_LINE:
    uVar1 = xmlUCSIsCatZl(codepoint);
    break;
  case XML_REGEXP_SEPAR_PARA:
    uVar1 = xmlUCSIsCatZp(codepoint);
    break;
  case XML_REGEXP_SYMBOL:
    uVar1 = xmlUCSIsCatS(codepoint);
    break;
  case XML_REGEXP_SYMBOL_MATH:
    uVar1 = xmlUCSIsCatSm(codepoint);
    break;
  case XML_REGEXP_SYMBOL_CURRENCY:
    uVar1 = xmlUCSIsCatSc(codepoint);
    break;
  case XML_REGEXP_SYMBOL_MODIFIER:
    uVar1 = xmlUCSIsCatSk(codepoint);
    break;
  case XML_REGEXP_SYMBOL_OTHERS:
    uVar1 = xmlUCSIsCatSo(codepoint);
    break;
  case XML_REGEXP_OTHER:
    goto switchD_001ad17d_caseD_83;
  case XML_REGEXP_OTHER_CONTROL:
    uVar1 = xmlUCSIsCatCc(codepoint);
    break;
  case XML_REGEXP_OTHER_FORMAT:
    uVar1 = xmlUCSIsCatCf(codepoint);
    break;
  case XML_REGEXP_OTHER_PRIVATE:
    uVar1 = xmlUCSIsCatCo(codepoint);
    break;
  case XML_REGEXP_OTHER_NA:
switchD_001ad17d_caseD_87:
    uVar1 = 0;
    bVar3 = false;
    break;
  case XML_REGEXP_BLOCK_NAME:
    uVar1 = xmlUCSIsBlock(codepoint,(char *)CONCAT44(in_register_00000084,end));
    bVar3 = bVar4;
    break;
  default:
    bVar5 = bVar3;
    bVar3 = bVar4;
    switch(type) {
    case XML_REGEXP_EPSILON:
    case XML_REGEXP_RANGES:
    case XML_REGEXP_SUBREG:
    case XML_REGEXP_STRING:
      return -1;
    case XML_REGEXP_CHARVAL:
      bVar3 = neg <= codepoint;
      bVar4 = codepoint <= start;
      goto LAB_001ad4fd;
    case XML_REGEXP_ANYCHAR:
      bVar3 = codepoint != 10;
      bVar4 = codepoint != 0xd;
LAB_001ad4fd:
      uVar1 = (uint)(byte)(bVar4 & bVar3);
      bVar3 = false;
      break;
    case XML_REGEXP_ANYSPACE:
      goto switchD_001ad1a1_caseD_7;
    case XML_REGEXP_NOTSPACE:
      bVar4 = true;
      goto switchD_001ad1a1_caseD_7;
    case XML_REGEXP_INITNAME:
      goto switchD_001ad1a1_caseD_9;
    case XML_REGEXP_NOTINITNAME:
      bVar3 = true;
switchD_001ad1a1_caseD_9:
      if (codepoint < 0x100) {
        uVar1 = 1;
        if (((codepoint - 0xc0U < 0x17) || ((codepoint & 0xffffffdfU) - 0x41 < 0x1a)) ||
           (0xf7 < codepoint || codepoint - 0xd8U < 0x1f)) break;
      }
      else {
        iVar2 = xmlCharInRange(codepoint,&xmlIsBaseCharGroup);
        uVar1 = 1;
        if (iVar2 != 0) break;
      }
      uVar1 = 1;
      if (codepoint < 0x100) {
        if (codepoint == 0x5f) break;
      }
      else if ((codepoint - 0x3021U < 9 || codepoint - 0x4e00U < 0x51a6) || codepoint == 0x3007)
      break;
      bVar5 = codepoint == 0x3a;
      bVar4 = bVar3;
      goto LAB_001ad5cf;
    case XML_REGEXP_NAMECHAR:
      goto switchD_001ad1a1_caseD_b;
    case XML_REGEXP_NOTNAMECHAR:
      bVar3 = true;
switchD_001ad1a1_caseD_b:
      if (codepoint < 0x100) {
        uVar1 = 1;
        if (((codepoint - 0xc0U < 0x17) || ((codepoint & 0xffffffdfU) - 0x41 < 0x1a)) ||
           (0xf7 < codepoint || codepoint - 0xd8U < 0x1f)) break;
      }
      else {
        iVar2 = xmlCharInRange(codepoint,&xmlIsBaseCharGroup);
        uVar1 = 1;
        if (iVar2 != 0) break;
      }
      uVar1 = 1;
      if (codepoint < 0x100) {
        if (codepoint - 0x30U < 10) break;
      }
      else if (((codepoint - 0x3021U < 9 || codepoint - 0x4e00U < 0x51a6) || codepoint == 0x3007) ||
              (iVar2 = xmlCharInRange(codepoint,&xmlIsDigitGroup), iVar2 != 0)) break;
      uVar1 = 1;
      if ((0x32 < codepoint - 0x2dU) ||
         ((0x4000000002003U >> ((ulong)(codepoint - 0x2dU) & 0x3f) & 1) == 0)) {
        if (codepoint < 0x100) {
          bVar4 = codepoint == 0xb7;
        }
        else {
          iVar2 = xmlCharInRange(codepoint,&xmlIsCombiningGroup);
          if (iVar2 != 0) break;
          iVar2 = xmlCharInRange(codepoint,&xmlIsExtenderGroup);
          bVar4 = iVar2 != 0;
        }
        uVar1 = (uint)bVar4;
      }
      break;
    case XML_REGEXP_NOTDECIMAL:
      bVar5 = true;
    case XML_REGEXP_DECIMAL:
switchD_001ad17d_caseD_6f:
      bVar3 = bVar5;
      uVar1 = xmlUCSIsCatNd(codepoint);
      break;
    case XML_REGEXP_REALCHAR:
      bVar4 = true;
    case XML_REGEXP_NOTREALCHAR:
      uVar1 = xmlUCSIsCatP(codepoint);
      if (uVar1 == 0) {
        uVar1 = xmlUCSIsCatZ(codepoint);
      }
      bVar3 = bVar4;
      if (uVar1 == 0) {
switchD_001ad17d_caseD_83:
        bVar3 = bVar4;
        uVar1 = xmlUCSIsCatC(codepoint);
      }
      break;
    default:
      goto switchD_001ad17d_caseD_87;
    }
  }
LAB_001ad513:
  if (bVar3) {
    uVar1 = (uint)(uVar1 == 0);
  }
  return uVar1;
switchD_001ad1a1_caseD_7:
  if ((0xd < (uint)codepoint) ||
     (uVar1 = 1, bVar3 = bVar4, (0x2600U >> (codepoint & 0x1fU) & 1) == 0)) {
    bVar5 = codepoint == 0x20;
LAB_001ad5cf:
    uVar1 = (uint)bVar5;
    bVar3 = bVar4;
  }
  goto LAB_001ad513;
}

Assistant:

static int
xmlRegCheckCharacterRange(xmlRegAtomType type, int codepoint, int neg,
	                  int start, int end, const xmlChar *blockName) {
    int ret = 0;

    switch (type) {
        case XML_REGEXP_STRING:
        case XML_REGEXP_SUBREG:
        case XML_REGEXP_RANGES:
        case XML_REGEXP_EPSILON:
	    return(-1);
        case XML_REGEXP_ANYCHAR:
	    ret = ((codepoint != '\n') && (codepoint != '\r'));
	    break;
        case XML_REGEXP_CHARVAL:
	    ret = ((codepoint >= start) && (codepoint <= end));
	    break;
        case XML_REGEXP_NOTSPACE:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_ANYSPACE:
	    ret = ((codepoint == '\n') || (codepoint == '\r') ||
		   (codepoint == '\t') || (codepoint == ' '));
	    break;
        case XML_REGEXP_NOTINITNAME:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_INITNAME:
	    ret = (IS_LETTER(codepoint) ||
		   (codepoint == '_') || (codepoint == ':'));
	    break;
        case XML_REGEXP_NOTNAMECHAR:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_NAMECHAR:
	    ret = (IS_LETTER(codepoint) || IS_DIGIT(codepoint) ||
		   (codepoint == '.') || (codepoint == '-') ||
		   (codepoint == '_') || (codepoint == ':') ||
		   IS_COMBINING(codepoint) || IS_EXTENDER(codepoint));
	    break;
        case XML_REGEXP_NOTDECIMAL:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_DECIMAL:
	    ret = xmlUCSIsCatNd(codepoint);
	    break;
        case XML_REGEXP_REALCHAR:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_NOTREALCHAR:
	    ret = xmlUCSIsCatP(codepoint);
	    if (ret == 0)
		ret = xmlUCSIsCatZ(codepoint);
	    if (ret == 0)
		ret = xmlUCSIsCatC(codepoint);
	    break;
        case XML_REGEXP_LETTER:
	    ret = xmlUCSIsCatL(codepoint);
	    break;
        case XML_REGEXP_LETTER_UPPERCASE:
	    ret = xmlUCSIsCatLu(codepoint);
	    break;
        case XML_REGEXP_LETTER_LOWERCASE:
	    ret = xmlUCSIsCatLl(codepoint);
	    break;
        case XML_REGEXP_LETTER_TITLECASE:
	    ret = xmlUCSIsCatLt(codepoint);
	    break;
        case XML_REGEXP_LETTER_MODIFIER:
	    ret = xmlUCSIsCatLm(codepoint);
	    break;
        case XML_REGEXP_LETTER_OTHERS:
	    ret = xmlUCSIsCatLo(codepoint);
	    break;
        case XML_REGEXP_MARK:
	    ret = xmlUCSIsCatM(codepoint);
	    break;
        case XML_REGEXP_MARK_NONSPACING:
	    ret = xmlUCSIsCatMn(codepoint);
	    break;
        case XML_REGEXP_MARK_SPACECOMBINING:
	    ret = xmlUCSIsCatMc(codepoint);
	    break;
        case XML_REGEXP_MARK_ENCLOSING:
	    ret = xmlUCSIsCatMe(codepoint);
	    break;
        case XML_REGEXP_NUMBER:
	    ret = xmlUCSIsCatN(codepoint);
	    break;
        case XML_REGEXP_NUMBER_DECIMAL:
	    ret = xmlUCSIsCatNd(codepoint);
	    break;
        case XML_REGEXP_NUMBER_LETTER:
	    ret = xmlUCSIsCatNl(codepoint);
	    break;
        case XML_REGEXP_NUMBER_OTHERS:
	    ret = xmlUCSIsCatNo(codepoint);
	    break;
        case XML_REGEXP_PUNCT:
	    ret = xmlUCSIsCatP(codepoint);
	    break;
        case XML_REGEXP_PUNCT_CONNECTOR:
	    ret = xmlUCSIsCatPc(codepoint);
	    break;
        case XML_REGEXP_PUNCT_DASH:
	    ret = xmlUCSIsCatPd(codepoint);
	    break;
        case XML_REGEXP_PUNCT_OPEN:
	    ret = xmlUCSIsCatPs(codepoint);
	    break;
        case XML_REGEXP_PUNCT_CLOSE:
	    ret = xmlUCSIsCatPe(codepoint);
	    break;
        case XML_REGEXP_PUNCT_INITQUOTE:
	    ret = xmlUCSIsCatPi(codepoint);
	    break;
        case XML_REGEXP_PUNCT_FINQUOTE:
	    ret = xmlUCSIsCatPf(codepoint);
	    break;
        case XML_REGEXP_PUNCT_OTHERS:
	    ret = xmlUCSIsCatPo(codepoint);
	    break;
        case XML_REGEXP_SEPAR:
	    ret = xmlUCSIsCatZ(codepoint);
	    break;
        case XML_REGEXP_SEPAR_SPACE:
	    ret = xmlUCSIsCatZs(codepoint);
	    break;
        case XML_REGEXP_SEPAR_LINE:
	    ret = xmlUCSIsCatZl(codepoint);
	    break;
        case XML_REGEXP_SEPAR_PARA:
	    ret = xmlUCSIsCatZp(codepoint);
	    break;
        case XML_REGEXP_SYMBOL:
	    ret = xmlUCSIsCatS(codepoint);
	    break;
        case XML_REGEXP_SYMBOL_MATH:
	    ret = xmlUCSIsCatSm(codepoint);
	    break;
        case XML_REGEXP_SYMBOL_CURRENCY:
	    ret = xmlUCSIsCatSc(codepoint);
	    break;
        case XML_REGEXP_SYMBOL_MODIFIER:
	    ret = xmlUCSIsCatSk(codepoint);
	    break;
        case XML_REGEXP_SYMBOL_OTHERS:
	    ret = xmlUCSIsCatSo(codepoint);
	    break;
        case XML_REGEXP_OTHER:
	    ret = xmlUCSIsCatC(codepoint);
	    break;
        case XML_REGEXP_OTHER_CONTROL:
	    ret = xmlUCSIsCatCc(codepoint);
	    break;
        case XML_REGEXP_OTHER_FORMAT:
	    ret = xmlUCSIsCatCf(codepoint);
	    break;
        case XML_REGEXP_OTHER_PRIVATE:
	    ret = xmlUCSIsCatCo(codepoint);
	    break;
        case XML_REGEXP_OTHER_NA:
	    /* ret = xmlUCSIsCatCn(codepoint); */
	    /* Seems it doesn't exist anymore in recent Unicode releases */
	    ret = 0;
	    break;
        case XML_REGEXP_BLOCK_NAME:
	    ret = xmlUCSIsBlock(codepoint, (const char *) blockName);
	    break;
    }
    if (neg)
	return(!ret);
    return(ret);
}